

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall
IO::writeHomotetramers
          (IO *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *homotetramer_arr
          ,string *filename)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  reference paVar4;
  reference pvVar5;
  ostream *poVar6;
  array<float,_2UL> local_250;
  array<float,_2UL> timestep;
  iterator __end1;
  iterator __begin1;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *__range1;
  string local_220 [8];
  ofstream outstream;
  string *filename_local;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *homotetramer_arr_local;
  IO *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,(_Ios_Openmode)filename);
  __end1 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::begin
                     (homotetramer_arr);
  timestep._M_elems =
       (_Type)std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::end
                        (homotetramer_arr);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::array<float,_2UL>_*,_std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                                *)&timestep);
    if (!bVar3) break;
    paVar4 = __gnu_cxx::
             __normal_iterator<std::array<float,_2UL>_*,_std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
             ::operator*(&__end1);
    local_250._M_elems = *&paVar4->_M_elems;
    pvVar5 = std::array<float,_2UL>::at(&local_250,0);
    fVar1 = *pvVar5;
    pvVar5 = std::array<float,_2UL>::at(&local_250,0);
    fVar2 = *pvVar5;
    pvVar5 = std::array<float,_2UL>::at(&local_250,1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_220,fVar1 / (fVar2 + *pvVar5));
    poVar6 = std::operator<<(poVar6,"\t");
    pvVar5 = std::array<float,_2UL>::at(&local_250,1);
    fVar1 = *pvVar5;
    pvVar5 = std::array<float,_2UL>::at(&local_250,0);
    fVar2 = *pvVar5;
    pvVar5 = std::array<float,_2UL>::at(&local_250,1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,fVar1 / (fVar2 + *pvVar5));
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::array<float,_2UL>_*,_std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void IO::writeHomotetramers(std::vector<std::array<float, 2>> homotetramer_arr, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (auto timestep: homotetramer_arr){
		outstream << timestep.at(0)/(timestep.at(0)+timestep.at(1)) << "\t"
						 << timestep.at(1)/(timestep.at(0)+timestep.at(1)) << std::endl;
	}
	outstream.close();
}